

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O0

int32_t __thiscall wasm::Random::get32(Random *this)

{
  int16_t iVar1;
  int16_t iVar2;
  uint32_t temp;
  Random *this_local;
  
  iVar1 = get16(this);
  iVar2 = get16(this);
  return (int)iVar1 << 0x10 | (int)iVar2;
}

Assistant:

int32_t Random::get32() {
  auto temp = uint32_t(get16()) << 16;
  return temp | uint32_t(get16());
}